

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_METAL_sampler(Context *ctx,int stage,TextureType ttype,int tb)

{
  undefined8 uVar1;
  uint uVar2;
  char regnum_str [16];
  char var [64];
  char acStack_b8 [64];
  char local_78 [72];
  
  if (2 < ttype - TEXTURE_TYPE_2D) {
    __assert_fail("!\"unexpected texture type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                  ,0x12d2,"void emit_METAL_sampler(Context *, int, TextureType, int)");
  }
  uVar1 = *(undefined8 *)(&DAT_0014a728 + (ulong)(ttype - TEXTURE_TYPE_2D) * 8);
  snprintf(acStack_b8,0x10,"%u",(ulong)(uint)stage);
  snprintf(local_78,0x40,"%s%s","s",acStack_b8);
  push_output(ctx,&ctx->mainline_arguments);
  ctx->indent = ctx->indent + 1;
  output_line(ctx,"texture%s<float> %s_texture [[texture(%d)]],",uVar1,local_78,(ulong)(uint)stage);
  output_line(ctx,"sampler %s [[sampler(%d)]],",local_78,(ulong)(uint)stage);
  if (0 < ctx->output_stack_len) {
    uVar2 = ctx->output_stack_len - 1;
    ctx->output_stack_len = uVar2;
    ctx->output = ctx->output_stack[uVar2];
    ctx->indent = ctx->indent_stack[uVar2];
    if (tb != 0) {
      push_output(ctx,&ctx->mainline_top);
      ctx->indent = ctx->indent + 1;
      uVar2 = ctx->uniform_float4_count;
      ctx->uniform_float4_count = uVar2 + 2;
      snprintf(acStack_b8,0x40,"uniforms.uniforms_%s","float4");
      output_line(ctx,"constant float4 &%s_texbem = %s[%d];",local_78,acStack_b8,(ulong)uVar2);
      output_line(ctx,"constant float4 &%s_texbeml = %s[%d];",local_78,acStack_b8,(ulong)(uVar2 + 1)
                 );
      if (ctx->output_stack_len < 1) goto LAB_0010f305;
      uVar2 = ctx->output_stack_len - 1;
      ctx->output_stack_len = uVar2;
      ctx->output = ctx->output_stack[uVar2];
      ctx->indent = ctx->indent_stack[uVar2];
    }
    return;
  }
LAB_0010f305:
  __assert_fail("ctx->output_stack_len > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                ,0x173,"void pop_output(Context *)");
}

Assistant:

static void emit_METAL_sampler(Context *ctx,int stage,TextureType ttype,int tb)
{
    char var[64];
    const char *texsuffix = NULL;
    switch (ttype)
    {
        case TEXTURE_TYPE_2D: texsuffix = "2d"; break;
        case TEXTURE_TYPE_CUBE: texsuffix = "cube"; break;
        case TEXTURE_TYPE_VOLUME: texsuffix = "3d"; break;
        default: assert(!"unexpected texture type"); return;
    } // switch

    get_METAL_varname_in_buf(ctx, REG_TYPE_SAMPLER, stage, var, sizeof (var));

    push_output(ctx, &ctx->mainline_arguments);
    ctx->indent++;
    output_line(ctx, "texture%s<float> %s_texture [[texture(%d)]],",
                texsuffix, var, stage);
    output_line(ctx, "sampler %s [[sampler(%d)]],", var, stage);
    pop_output(ctx);

    if (tb)  // This sampler used a ps_1_1 TEXBEM opcode?
    {
        push_output(ctx, &ctx->mainline_top);
        ctx->indent++;
        char name[64];
        const int index = ctx->uniform_float4_count;
        ctx->uniform_float4_count += 2;
        get_METAL_uniform_array_varname(ctx, REG_TYPE_CONST, name, sizeof (name));
        output_line(ctx, "constant float4 &%s_texbem = %s[%d];", var, name, index);
        output_line(ctx, "constant float4 &%s_texbeml = %s[%d];", var, name, index+1);
        pop_output(ctx);
    } // if
}